

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_DESTRUCTION(effect_handler_context_t *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  wchar_t wVar3;
  int x;
  int y;
  player_upkeep *ppVar4;
  player_state_conflict state;
  wchar_t wVar5;
  player *ppVar6;
  _Bool _Var7;
  wchar_t wVar8;
  uint32_t uVar9;
  loc_conflict grid1;
  square *psVar10;
  object *obj;
  long lVar11;
  player_state_conflict *ppVar12;
  wchar_t wVar13;
  undefined8 *puVar14;
  wchar_t wVar15;
  loc grid;
  bool bVar16;
  byte bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined1 in_stack_fffffffffffffe58 [312];
  undefined4 uVar44;
  
  ppVar6 = player;
  bVar17 = 0;
  wVar13 = context->subtype;
  wVar3 = context->radius;
  x = (player->grid).x;
  y = (player->grid).y;
  context->ident = true;
  if ((ppVar6->depth == 0) || (ppVar6->upkeep->arena_level == true)) {
    msg("The ground shakes for a moment.");
    return true;
  }
  if (y - wVar3 <= y + wVar3) {
    wVar5 = y - wVar3;
    do {
      wVar15 = x - wVar3;
      if (x - wVar3 <= x + wVar3) {
        do {
          grid.y = wVar5;
          grid.x = wVar15;
          _Var7 = square_in_bounds_fully(cave,grid);
          if (_Var7) {
            grid1 = loc(x,y);
            wVar8 = distance(grid1,(loc_conflict)grid);
            if (wVar8 <= wVar3) {
              psVar10 = square(cave,grid);
              flag_off(psVar10->info,3,4);
              psVar10 = square(cave,grid);
              flag_off(psVar10->info,3,3);
              _Var7 = square_isbright(cave,grid);
              if (!_Var7) {
                psVar10 = square(cave,grid);
                flag_off(psVar10->info,3,2);
              }
              psVar10 = square(cave,grid);
              flag_off(psVar10->info,3,5);
              square_forget(cave,grid);
              square_light_spot((chunk *)cave,grid);
              _Var7 = loc_eq((loc_conflict)grid,player->grid);
              if (!_Var7) {
                delete_monster((chunk *)cave,grid);
                _Var7 = square_ispermanent(cave,grid);
                if (!_Var7) {
                  for (obj = square_object(cave,grid); obj != (object *)0x0; obj = obj->next) {
                    if (obj->artifact != (artifact *)0x0) {
                      if (((player->opts).opt[0x23] != false) ||
                         (_Var7 = obj_is_known_artifact(obj), _Var7)) {
                        history_lose_artifact(player,obj->artifact);
                        _Var7 = true;
                      }
                      else {
                        _Var7 = false;
                      }
                      mark_artifact_created(obj->artifact,_Var7);
                    }
                  }
                  square_excise_all_imagined((chunk_conflict *)player->cave,cave,grid);
                  square_excise_pile((chunk_conflict *)player->cave,grid);
                  square_excise_pile(cave,grid);
                  square_destroy(cave,grid);
                }
              }
            }
          }
          bVar16 = wVar15 != x + wVar3;
          wVar15 = wVar15 + L'\x01';
        } while (bVar16);
      }
      bVar16 = wVar5 != y + wVar3;
      wVar5 = wVar5 + L'\x01';
    } while (bVar16);
  }
  if (wVar13 == L'\x06') {
    msg("Darkness seems to crush you!");
    equip_learn_element(player,L'\x06');
    ppVar12 = &player->state;
    puVar14 = (undefined8 *)&stack0xfffffffffffffe58;
    for (lVar11 = 0x27; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar14 = *(undefined8 *)ppVar12->stat_add;
      ppVar12 = (player_state_conflict *)((long)ppVar12 + (ulong)bVar17 * -0x10 + 8);
      puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
    }
    uVar44 = *(undefined4 *)&(player->state).el_info[0x1b].flags;
    wVar13 = L'\x06';
  }
  else {
    if (wVar13 != L'\x05') goto LAB_0013b36b;
    msg("There is a searing blast of light!");
    equip_learn_element(player,L'\x05');
    ppVar12 = &player->state;
    puVar14 = (undefined8 *)&stack0xfffffffffffffe58;
    for (lVar11 = 0x27; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar14 = *(undefined8 *)ppVar12->stat_add;
      ppVar12 = (player_state_conflict *)((long)ppVar12 + (ulong)bVar17 * -0x10 + 8);
      puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
    }
    uVar44 = *(undefined4 *)&(player->state).el_info[0x1b].flags;
    wVar13 = L'\x05';
  }
  state.el_info[0x1b].flags = (char)uVar44;
  state.el_info[0x1b]._3_1_ = (char)((uint)uVar44 >> 8);
  state._314_2_ = (short)((uint)uVar44 >> 0x10);
  uVar44 = in_stack_fffffffffffffe58._202_4_;
  uVar18 = in_stack_fffffffffffffe58._206_4_;
  uVar19 = in_stack_fffffffffffffe58._210_4_;
  uVar20 = in_stack_fffffffffffffe58._214_4_;
  uVar21 = in_stack_fffffffffffffe58._218_4_;
  uVar22 = in_stack_fffffffffffffe58._222_4_;
  uVar23 = in_stack_fffffffffffffe58._226_4_;
  uVar24 = in_stack_fffffffffffffe58._230_4_;
  uVar25 = in_stack_fffffffffffffe58._234_4_;
  uVar26 = in_stack_fffffffffffffe58._238_4_;
  uVar27 = in_stack_fffffffffffffe58._242_4_;
  uVar28 = in_stack_fffffffffffffe58._246_4_;
  uVar29 = in_stack_fffffffffffffe58._250_4_;
  uVar30 = in_stack_fffffffffffffe58._254_4_;
  uVar31 = in_stack_fffffffffffffe58._258_4_;
  uVar32 = in_stack_fffffffffffffe58._262_4_;
  uVar33 = in_stack_fffffffffffffe58._266_4_;
  uVar34 = in_stack_fffffffffffffe58._270_4_;
  uVar35 = in_stack_fffffffffffffe58._274_4_;
  uVar36 = in_stack_fffffffffffffe58._278_4_;
  uVar37 = in_stack_fffffffffffffe58._282_4_;
  uVar38 = in_stack_fffffffffffffe58._286_4_;
  uVar39 = in_stack_fffffffffffffe58._290_4_;
  uVar40 = in_stack_fffffffffffffe58._294_4_;
  uVar41 = in_stack_fffffffffffffe58._298_4_;
  uVar42 = in_stack_fffffffffffffe58._302_4_;
  uVar43 = in_stack_fffffffffffffe58._306_4_;
  state.stat_add[0] = in_stack_fffffffffffffe58._0_4_;
  state.stat_add[1] = in_stack_fffffffffffffe58._4_4_;
  state.stat_add[2] = in_stack_fffffffffffffe58._8_4_;
  state.stat_add[3] = in_stack_fffffffffffffe58._12_4_;
  state.stat_add[4] = in_stack_fffffffffffffe58._16_4_;
  state.stat_ind[0] = in_stack_fffffffffffffe58._20_4_;
  state.stat_ind[1] = in_stack_fffffffffffffe58._24_4_;
  state.stat_ind[2] = in_stack_fffffffffffffe58._28_4_;
  state.stat_ind[3] = in_stack_fffffffffffffe58._32_4_;
  state.stat_ind[4] = in_stack_fffffffffffffe58._36_4_;
  state.stat_use[0] = in_stack_fffffffffffffe58._40_4_;
  state.stat_use[1] = in_stack_fffffffffffffe58._44_4_;
  state.stat_use[2] = in_stack_fffffffffffffe58._48_4_;
  state.stat_use[3] = in_stack_fffffffffffffe58._52_4_;
  state.stat_use[4] = in_stack_fffffffffffffe58._56_4_;
  state.stat_top[0] = in_stack_fffffffffffffe58._60_4_;
  state.stat_top[1] = in_stack_fffffffffffffe58._64_4_;
  state.stat_top[2] = in_stack_fffffffffffffe58._68_4_;
  state.stat_top[3] = in_stack_fffffffffffffe58._72_4_;
  state.stat_top[4] = in_stack_fffffffffffffe58._76_4_;
  state.skills[0] = in_stack_fffffffffffffe58._80_4_;
  state.skills[1] = in_stack_fffffffffffffe58._84_4_;
  state.skills[2] = in_stack_fffffffffffffe58._88_4_;
  state.skills[3] = in_stack_fffffffffffffe58._92_4_;
  state.skills[4] = in_stack_fffffffffffffe58._96_4_;
  state.skills[5] = in_stack_fffffffffffffe58._100_4_;
  state.skills[6] = in_stack_fffffffffffffe58._104_4_;
  state.skills[7] = in_stack_fffffffffffffe58._108_4_;
  state.skills[8] = in_stack_fffffffffffffe58._112_4_;
  state.skills[9] = in_stack_fffffffffffffe58._116_4_;
  state.speed = in_stack_fffffffffffffe58._120_4_;
  state.num_blows = in_stack_fffffffffffffe58._124_4_;
  state.num_shots = in_stack_fffffffffffffe58._128_4_;
  state.num_moves = in_stack_fffffffffffffe58._132_4_;
  state.ammo_mult = in_stack_fffffffffffffe58._136_4_;
  state.ammo_tval = in_stack_fffffffffffffe58._140_4_;
  state.ac = in_stack_fffffffffffffe58._144_4_;
  state.dam_red = in_stack_fffffffffffffe58._148_4_;
  state.perc_dam_red = in_stack_fffffffffffffe58._152_4_;
  state.to_a = in_stack_fffffffffffffe58._156_4_;
  state.to_h = in_stack_fffffffffffffe58._160_4_;
  state.to_d = in_stack_fffffffffffffe58._164_4_;
  state.see_infra = in_stack_fffffffffffffe58._168_4_;
  state.cur_light = in_stack_fffffffffffffe58._172_4_;
  state.evasion_chance = in_stack_fffffffffffffe58._176_4_;
  state.shield_on_back = (_Bool)in_stack_fffffffffffffe58[0xb4];
  state.heavy_wield = (_Bool)in_stack_fffffffffffffe58[0xb5];
  state.heavy_shoot = (_Bool)in_stack_fffffffffffffe58[0xb6];
  state.bless_wield = (_Bool)in_stack_fffffffffffffe58[0xb7];
  state.cumber_armor = (_Bool)in_stack_fffffffffffffe58[0xb8];
  state.flags[0] = in_stack_fffffffffffffe58[0xb9];
  state.flags[1] = in_stack_fffffffffffffe58[0xba];
  state.flags[2] = in_stack_fffffffffffffe58[0xbb];
  state.flags[3] = in_stack_fffffffffffffe58[0xbc];
  state.flags[4] = in_stack_fffffffffffffe58[0xbd];
  state.flags[5] = in_stack_fffffffffffffe58[0xbe];
  state.pflags[0] = in_stack_fffffffffffffe58[0xbf];
  state.pflags[1] = in_stack_fffffffffffffe58[0xc0];
  state.pflags[2] = in_stack_fffffffffffffe58[0xc1];
  state.pflags[3] = in_stack_fffffffffffffe58[0xc2];
  state.pflags[4] = in_stack_fffffffffffffe58[0xc3];
  state.pflags[5] = in_stack_fffffffffffffe58[0xc4];
  state.pflags[6] = in_stack_fffffffffffffe58[0xc5];
  state.pflags[7] = in_stack_fffffffffffffe58[0xc6];
  state.pflags[8] = in_stack_fffffffffffffe58[199];
  state.pflags[9] = in_stack_fffffffffffffe58[200];
  state._201_1_ = in_stack_fffffffffffffe58[0xc9];
  state.el_info[0].res_level = (short)uVar44;
  state.el_info[0].flags = (char)((uint)uVar44 >> 0x10);
  state.el_info[0]._3_1_ = (char)((uint)uVar44 >> 0x18);
  state.el_info[1].res_level = (short)uVar18;
  state.el_info[1].flags = (char)((uint)uVar18 >> 0x10);
  state.el_info[1]._3_1_ = (char)((uint)uVar18 >> 0x18);
  state.el_info[2].res_level = (short)uVar19;
  state.el_info[2].flags = (char)((uint)uVar19 >> 0x10);
  state.el_info[2]._3_1_ = (char)((uint)uVar19 >> 0x18);
  state.el_info[3].res_level = (short)uVar20;
  state.el_info[3].flags = (char)((uint)uVar20 >> 0x10);
  state.el_info[3]._3_1_ = (char)((uint)uVar20 >> 0x18);
  state.el_info[4].res_level = (short)uVar21;
  state.el_info[4].flags = (char)((uint)uVar21 >> 0x10);
  state.el_info[4]._3_1_ = (char)((uint)uVar21 >> 0x18);
  state.el_info[5].res_level = (short)uVar22;
  state.el_info[5].flags = (char)((uint)uVar22 >> 0x10);
  state.el_info[5]._3_1_ = (char)((uint)uVar22 >> 0x18);
  state.el_info[6].res_level = (short)uVar23;
  state.el_info[6].flags = (char)((uint)uVar23 >> 0x10);
  state.el_info[6]._3_1_ = (char)((uint)uVar23 >> 0x18);
  state.el_info[7].res_level = (short)uVar24;
  state.el_info[7].flags = (char)((uint)uVar24 >> 0x10);
  state.el_info[7]._3_1_ = (char)((uint)uVar24 >> 0x18);
  state.el_info[8].res_level = (short)uVar25;
  state.el_info[8].flags = (char)((uint)uVar25 >> 0x10);
  state.el_info[8]._3_1_ = (char)((uint)uVar25 >> 0x18);
  state.el_info[9].res_level = (short)uVar26;
  state.el_info[9].flags = (char)((uint)uVar26 >> 0x10);
  state.el_info[9]._3_1_ = (char)((uint)uVar26 >> 0x18);
  state.el_info[10].res_level = (short)uVar27;
  state.el_info[10].flags = (char)((uint)uVar27 >> 0x10);
  state.el_info[10]._3_1_ = (char)((uint)uVar27 >> 0x18);
  state.el_info[0xb].res_level = (short)uVar28;
  state.el_info[0xb].flags = (char)((uint)uVar28 >> 0x10);
  state.el_info[0xb]._3_1_ = (char)((uint)uVar28 >> 0x18);
  state.el_info[0xc].res_level = (short)uVar29;
  state.el_info[0xc].flags = (char)((uint)uVar29 >> 0x10);
  state.el_info[0xc]._3_1_ = (char)((uint)uVar29 >> 0x18);
  state.el_info[0xd].res_level = (short)uVar30;
  state.el_info[0xd].flags = (char)((uint)uVar30 >> 0x10);
  state.el_info[0xd]._3_1_ = (char)((uint)uVar30 >> 0x18);
  state.el_info[0xe].res_level = (short)uVar31;
  state.el_info[0xe].flags = (char)((uint)uVar31 >> 0x10);
  state.el_info[0xe]._3_1_ = (char)((uint)uVar31 >> 0x18);
  state.el_info[0xf].res_level = (short)uVar32;
  state.el_info[0xf].flags = (char)((uint)uVar32 >> 0x10);
  state.el_info[0xf]._3_1_ = (char)((uint)uVar32 >> 0x18);
  state.el_info[0x10].res_level = (short)uVar33;
  state.el_info[0x10].flags = (char)((uint)uVar33 >> 0x10);
  state.el_info[0x10]._3_1_ = (char)((uint)uVar33 >> 0x18);
  state.el_info[0x11].res_level = (short)uVar34;
  state.el_info[0x11].flags = (char)((uint)uVar34 >> 0x10);
  state.el_info[0x11]._3_1_ = (char)((uint)uVar34 >> 0x18);
  state.el_info[0x12].res_level = (short)uVar35;
  state.el_info[0x12].flags = (char)((uint)uVar35 >> 0x10);
  state.el_info[0x12]._3_1_ = (char)((uint)uVar35 >> 0x18);
  state.el_info[0x13].res_level = (short)uVar36;
  state.el_info[0x13].flags = (char)((uint)uVar36 >> 0x10);
  state.el_info[0x13]._3_1_ = (char)((uint)uVar36 >> 0x18);
  state.el_info[0x14].res_level = (short)uVar37;
  state.el_info[0x14].flags = (char)((uint)uVar37 >> 0x10);
  state.el_info[0x14]._3_1_ = (char)((uint)uVar37 >> 0x18);
  state.el_info[0x15].res_level = (short)uVar38;
  state.el_info[0x15].flags = (char)((uint)uVar38 >> 0x10);
  state.el_info[0x15]._3_1_ = (char)((uint)uVar38 >> 0x18);
  state.el_info[0x16].res_level = (short)uVar39;
  state.el_info[0x16].flags = (char)((uint)uVar39 >> 0x10);
  state.el_info[0x16]._3_1_ = (char)((uint)uVar39 >> 0x18);
  state.el_info[0x17].res_level = (short)uVar40;
  state.el_info[0x17].flags = (char)((uint)uVar40 >> 0x10);
  state.el_info[0x17]._3_1_ = (char)((uint)uVar40 >> 0x18);
  state.el_info[0x18].res_level = (short)uVar41;
  state.el_info[0x18].flags = (char)((uint)uVar41 >> 0x10);
  state.el_info[0x18]._3_1_ = (char)((uint)uVar41 >> 0x18);
  state.el_info[0x19].res_level = (short)uVar42;
  state.el_info[0x19].flags = (char)((uint)uVar42 >> 0x10);
  state.el_info[0x19]._3_1_ = (char)((uint)uVar42 >> 0x18);
  state.el_info[0x1a].res_level = (short)uVar43;
  state.el_info[0x1a].flags = (char)((uint)uVar43 >> 0x10);
  state.el_info[0x1a]._3_1_ = (char)((uint)uVar43 >> 0x18);
  state.el_info[0x1b].res_level = in_stack_fffffffffffffe58._310_2_;
  _Var7 = player_resists_effects(state,wVar13);
  ppVar6 = player;
  if (!_Var7) {
    uVar9 = Rand_div(10);
    player_inc_timed(ppVar6,L'\x02',uVar9 + L'\v',true,true,true);
  }
LAB_0013b36b:
  ppVar4 = player->upkeep;
  puVar1 = &ppVar4->update;
  *puVar1 = *puVar1 | 0xc0;
  pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc0;
  return true;
}

Assistant:

bool effect_handler_DESTRUCTION(effect_handler_context_t *context)
{
	int k, r = context->radius;
	int elem = context->subtype;
	int py = player->grid.y;
	int px = player->grid.x;
	struct loc grid;

	context->ident = true;

	/* No effect in town or arena */
	if ((!player->depth) || (player->upkeep->arena_level)) {
		msg("The ground shakes for a moment.");
		return true;
	}

	/* Big area of affect */
	for (grid.y = (py - r); grid.y <= (py + r); grid.y++) {
		for (grid.x = (px - r); grid.x <= (px + r); grid.x++) {
			/* Skip illegal grids */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Extract the distance */
			k = distance(loc(px, py), grid);

			/* Stay in the circle of death */
			if (k > r) continue;

			/* Lose room and vault */
			sqinfo_off(square(cave, grid)->info, SQUARE_ROOM);
			sqinfo_off(square(cave, grid)->info, SQUARE_VAULT);

			/* Forget completely */
			if (!square_isbright(cave, grid)) {
				sqinfo_off(square(cave, grid)->info, SQUARE_GLOW);
			}
			sqinfo_off(square(cave, grid)->info, SQUARE_SEEN);
			square_forget(cave, grid);
			square_light_spot(cave, grid);

			/* Deal with player later */
			if (loc_eq(grid, player->grid)) continue;

			/* Delete the monster (if any) */
			delete_monster(cave, grid);

			/* Destroy any grid that isn't permament */
			if (!square_ispermanent(cave, grid)) {
				/* Deal with artifacts */
				struct object *obj = square_object(cave, grid);
				while (obj) {
					if (obj->artifact) {
						if (OPT(player, birth_lose_arts) ||
							obj_is_known_artifact(obj)) {
							history_lose_artifact(player, obj->artifact);
							mark_artifact_created(
								obj->artifact,
								true);
						} else {
							mark_artifact_created(
								obj->artifact,
								false);
						}
					}
					obj = obj->next;
				}

				/* Delete objects */
				square_excise_all_imagined(player->cave, cave,
					grid);
				square_excise_pile(player->cave, grid);
				square_excise_pile(cave, grid);
				square_destroy(cave, grid);
			}
		}
	}

	/* Player is affected */
	if (elem == ELEM_LIGHT) {
		msg("There is a searing blast of light!");
		equip_learn_element(player, ELEM_LIGHT);
		if (!player_resists_effects(player->state, ELEM_LIGHT)) {
			(void)player_inc_timed(player, TMD_BLIND, 10 + randint1(10), true,
								   true, true);
		}
	} else if (elem == ELEM_DARK) {
		msg("Darkness seems to crush you!");
		equip_learn_element(player, ELEM_DARK);
		if (!player_resists_effects(player->state, ELEM_DARK)) {
			(void)player_inc_timed(player, TMD_BLIND, 10 + randint1(10), true,
								   true, true);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}